

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.hpp
# Opt level: O2

ssize_t __thiscall
boost::deflate::detail::window::write(window *this,int __fd,void *__buf,size_t __n)

{
  pointer __p_00;
  void *pvVar1;
  ushort uVar2;
  undefined4 in_register_00000034;
  ulong uVar3;
  void *__n_00;
  size_t __n_01;
  pointer __p;
  ushort uVar4;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_30;
  
  pvVar1 = (void *)CONCAT44(in_register_00000034,__fd);
  if ((this->p_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl == (uchar *)0x0) {
    uVar4 = this->capacity_;
    __p_00 = (pointer)operator_new__((ulong)uVar4);
    memset(__p_00,0,(ulong)uVar4);
    local_30._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)this,__p_00)
    ;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_30);
  }
  __n_00 = (void *)(ulong)this->capacity_;
  if (__buf < __n_00) {
    uVar3 = (ulong)this->i_;
    if (__n_00 < (void *)(uVar3 + (long)__buf)) {
      __n_01 = (long)__n_00 - uVar3;
      memcpy((this->p_)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar3,pvVar1,__n_01);
      uVar4 = (short)__buf - (short)__n_01;
      this->i_ = uVar4;
      memcpy((this->p_)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
             (void *)((long)pvVar1 + __n_01),(ulong)uVar4);
      pvVar1 = (void *)(ulong)this->capacity_;
      this->size_ = this->capacity_;
    }
    else {
      memcpy((this->p_)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar3,pvVar1,(size_t)__buf
            );
      uVar4 = this->capacity_;
      uVar2 = this->size_ + (short)__buf;
      if ((ulong)uVar4 - (long)__buf <= (ulong)this->size_) {
        uVar2 = uVar4;
      }
      this->size_ = uVar2;
      uVar3 = (ulong)((uint)this->i_ + (int)__buf);
      pvVar1 = (void *)(uVar3 / uVar4);
      this->i_ = (uint16_t)(uVar3 % (ulong)uVar4);
    }
  }
  else {
    this->i_ = 0;
    this->size_ = this->capacity_;
    pvVar1 = memcpy((this->p_)._M_t.
                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                    (void *)((long)pvVar1 + ((long)__buf - (long)__n_00)),(size_t)__n_00);
  }
  return (ssize_t)pvVar1;
}

Assistant:

void
    write(std::uint8_t const* in, std::size_t n)
    {
        if(! p_)
            p_ = boost::make_unique<
                std::uint8_t[]>(capacity_);
        if(n >= capacity_)
        {
            i_ = 0;
            size_ = capacity_;
            std::memcpy(&p_[0], in + (n - size_), size_);
            return;
        }
        if(i_ + n <= capacity_)
        {
            std::memcpy(&p_[i_], in, n);
            if(size_ >= capacity_ - n)
                size_ = capacity_;
            else
                size_ = static_cast<std::uint16_t>(size_ + n);

            i_ = static_cast<std::uint16_t>(
                (i_ + n) % capacity_);
            return;
        }
        auto m = capacity_ - i_;
        std::memcpy(&p_[i_], in, m);
        in += m;
        i_ = static_cast<std::uint16_t>(n - m);
        std::memcpy(&p_[0], in, i_);
        size_ = capacity_;
    }